

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmPTest<(moira::Instr)185,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 *this_00;
  bool bVar1;
  StrWriter *pSVar2;
  char *local_78;
  An local_5c [2];
  Ea<(moira::Mode)8,_2> local_54;
  Fc local_3c;
  int local_38;
  byte local_32;
  byte local_31;
  byte local_30;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  u8 fc;
  u32 uStack_2c;
  u8 an;
  u8 a;
  u8 rw;
  u8 lev;
  u8 reg;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  _a = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  uStack_2c = dasmIncRead<2>(this,addr);
  local_2d = (byte)ext._2_2_ & 7;
  local_2e = (byte)(uStack_2c >> 10) & 7;
  local_2f = (byte)(uStack_2c >> 9) & 1;
  local_30 = (byte)(uStack_2c >> 8) & 1;
  local_31 = (byte)(uStack_2c >> 5) & 7;
  local_32 = (byte)uStack_2c & 0x1f;
  if (((**(int **)(addr_local + 0xc) != 2) && (**(int **)(addr_local + 0xc) != 3)) ||
     (bVar1 = isValidExtMMU(this,PTEST,AL,ext._2_2_,uStack_2c), bVar1)) {
    pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
    if (local_2f == 0) {
      local_78 = "w";
    }
    else {
      local_78 = "r";
    }
    pSVar2 = StrWriter::operator<<(pSVar2,local_78);
    local_38 = addr_local[0xe];
    StrWriter::operator<<(pSVar2,(Tab)local_38);
    this_00 = addr_local;
    Fc::Fc(&local_3c,(uint)local_32);
    pSVar2 = StrWriter::operator<<((StrWriter *)this_00,local_3c);
    pSVar2 = StrWriter::operator<<(pSVar2);
    Op<(moira::Mode)8,2>(&local_54,this,(ushort)local_2d,_old);
    pSVar2 = StrWriter::operator<<(pSVar2,&local_54);
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,(uint)local_2e);
    if (local_30 != 0) {
      pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
      An::An(local_5c,(uint)local_31);
      StrWriter::operator<<(pSVar2,local_5c[0]);
    }
  }
  else {
    *_old = _a;
    dasmIllegal<(moira::Instr)185,(moira::Mode)8,4>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  return;
}

Assistant:

void
Moira::dasmPTest(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<Word>(addr);
    auto reg = _____________xxx (op);
    auto lev = ___xxx__________ (ext);
    auto rw  = ______x_________ (ext);
    auto a   = _______x________ (ext);
    auto an  = ________xxx_____ (ext);
    auto fc  = ___________xxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << (rw ? "r" : "w") << str.tab;
    str << Fc{fc} << Sep{} << Op<M>(reg, addr) << Sep{} << lev;
    if (a) { str << Sep{} << An{an}; }
}